

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O1

JsrtDebuggerObjectBase *
JsrtDebuggerObjectFunction::Make
          (JsrtDebuggerObjectsManager *debuggerObjectsManager,JavascriptFunction *javascriptFunction
          )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocator *alloc;
  JsrtDebuggerObjectFunction *this;
  JavascriptFunction *local_30;
  JsrtDebuggerObjectFunction *local_28;
  JsrtDebuggerObjectBase *debuggerObject;
  
  local_28 = (JsrtDebuggerObjectFunction *)0x0;
  local_30 = javascriptFunction;
  if (debuggerObjectsManager->dataToDebuggerObjectsDictionary !=
      (DataToDebuggerObjectsDictionary *)0x0) {
    bVar2 = JsUtil::
            BaseDictionary<void*,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
            ::TryGetValue<void*>
                      ((BaseDictionary<void*,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                        *)debuggerObjectsManager->dataToDebuggerObjectsDictionary,&local_30,
                       (JsrtDebuggerObjectBase **)&local_28);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                         ,0x2ca,
                         "(!debuggerObjectsManager->TryGetDataFromDataToDebuggerObjectsDictionary(javascriptFunction, &debuggerObject))"
                         ,
                         "!debuggerObjectsManager->TryGetDataFromDataToDebuggerObjectsDictionary(javascriptFunction, &debuggerObject)"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  alloc = JsrtDebugManager::GetDebugObjectArena(debuggerObjectsManager->jsrtDebugManager);
  this = (JsrtDebuggerObjectFunction *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
  JsrtDebuggerObjectFunction(this,debuggerObjectsManager,javascriptFunction);
  local_28 = this;
  JsrtDebuggerObjectsManager::AddToDataToDebuggerObjectsDictionary
            (debuggerObjectsManager,javascriptFunction,(JsrtDebuggerObjectBase *)this);
  return &local_28->super_JsrtDebuggerObjectBase;
}

Assistant:

JsrtDebuggerObjectBase * JsrtDebuggerObjectFunction::Make(JsrtDebuggerObjectsManager * debuggerObjectsManager, Js::JavascriptFunction* javascriptFunction)
{
    JsrtDebuggerObjectBase* debuggerObject = nullptr;

    Assert(!debuggerObjectsManager->TryGetDataFromDataToDebuggerObjectsDictionary(javascriptFunction, &debuggerObject));
    
    debuggerObject = Anew(debuggerObjectsManager->GetDebugObjectArena(), JsrtDebuggerObjectFunction, debuggerObjectsManager, javascriptFunction);

    debuggerObjectsManager->AddToDataToDebuggerObjectsDictionary(javascriptFunction, debuggerObject);

    return debuggerObject;
}